

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

Memory * LiteScript::Memory::Load(Memory *__return_storage_ptr__,istream *stream)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_> *this;
  size_type sVar4;
  const_reference ppTVar5;
  char *__rhs;
  uint local_64;
  uint sz_j;
  uint j;
  uint i;
  uchar c;
  string str;
  uint sz;
  vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_> *types;
  istream *stream_local;
  Memory *memory;
  
  Memory(__return_storage_ptr__);
  this = Type::GetTypesList();
  uVar3 = IStreamer::Read<unsigned_int>(stream);
  std::__cxx11::string::string((string *)&i);
  for (sz_j = 0; sz_j < uVar3; sz_j = sz_j + 1) {
    std::__cxx11::string::clear();
    while (cVar1 = std::istream::get(), cVar1 != '\0') {
      std::__cxx11::string::operator+=((string *)&i,cVar1);
    }
    local_64 = 0;
    sVar4 = std::vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>::size(this);
    for (; local_64 < (uint)sVar4; local_64 = local_64 + 1) {
      ppTVar5 = std::vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>::operator[]
                          (this,(ulong)local_64);
      __rhs = Type::GetName(*ppTVar5);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,__rhs);
      if (bVar2) {
        ppTVar5 = std::vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>::operator[]
                            (this,(ulong)local_64);
        std::vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>::push_back
                  (&__return_storage_ptr__->type_list,ppTVar5);
        break;
      }
    }
    sVar4 = std::vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>::size
                      (&__return_storage_ptr__->type_list);
    if (sz_j == sVar4) goto LAB_00155c8b;
  }
  uVar3 = IStreamer::Read<unsigned_int>(stream);
  while (__return_storage_ptr__->count < uVar3) {
    LoadVariable(__return_storage_ptr__,stream);
    __return_storage_ptr__->count = __return_storage_ptr__->count + 1;
  }
LAB_00155c8b:
  std::__cxx11::string::~string((string *)&i);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Memory LiteScript::Memory::Load(std::istream &stream) {
    Memory memory;
    const std::vector<Type *>& types = Type::GetTypesList();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string str;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        str.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            str += c;
        for (unsigned int j = 0, sz_j = types.size(); j < sz_j; j++) {
            if (str == types[j]->GetName()) {
                memory.type_list.push_back(types[j]);
                break;
            }
        }
        if (i == memory.type_list.size())
            return memory;
    }
    sz = IStreamer::Read<unsigned int>(stream);
    for (; memory.count < sz; memory.count++)
        memory.LoadVariable(stream);
    return memory;
}